

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds)

{
  SizeType l;
  SizeType s;
  bool bVar1;
  uint *puVar2;
  uint *puVar3;
  Frag *pFVar4;
  Operator *pOVar5;
  State *pSVar6;
  char *__function;
  char *pcVar7;
  uint c;
  uint uVar8;
  SizeType range;
  uint m;
  uint codepoint;
  Stack<rapidjson::CrtAllocator> operandStack;
  Stack<rapidjson::CrtAllocator> atomCountStack;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  Stack<rapidjson::CrtAllocator> local_c0;
  Stack<rapidjson::CrtAllocator> local_90;
  Stack<rapidjson::CrtAllocator> local_60;
  
  local_c0.allocator_ = *(CrtAllocator **)(this + 8);
  local_90.ownAllocator_ = (CrtAllocator *)0x0;
  local_90.stack_ = (char *)0x0;
  local_90.stackTop_ = (char *)0x0;
  local_90.stackEnd_ = (char *)0x0;
  local_90.initialCapacity_ = 0x100;
  local_c0.ownAllocator_ = (CrtAllocator *)0x0;
  local_c0.stack_ = (char *)0x0;
  local_c0.stackTop_ = (char *)0x0;
  local_c0.stackEnd_ = (char *)0x0;
  local_c0.initialCapacity_ = 0x100;
  local_60.ownAllocator_ = (CrtAllocator *)0x0;
  local_60.stack_ = (char *)0x0;
  local_60.stackTop_ = (char *)0x0;
  local_60.stackEnd_ = (char *)0x0;
  local_60.initialCapacity_ = 0x100;
  local_90.allocator_ = local_c0.allocator_;
  local_60.allocator_ = local_c0.allocator_;
  puVar2 = Stack<rapidjson::CrtAllocator>::Push<unsigned_int>(&local_60,1);
  *puVar2 = 0;
  uVar8 = ds->codepoint_;
  if (uVar8 != 0) {
    puVar2 = &ds->codepoint_;
    do {
      bVar1 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                        (ds->ss_,puVar2);
      if (!bVar1) {
        *puVar2 = 0;
      }
      local_c4 = uVar8;
      if ((int)uVar8 < 0x3f) {
        switch(uVar8) {
        case 0x24:
          this[0x7d] = (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>)0x1;
          break;
        default:
switchD_00123b62_caseD_25:
          uVar8 = local_c4;
          goto LAB_00123cae;
        case 0x28:
          pOVar5 = Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                             (&local_c0,1);
          *pOVar5 = kLeftParenthesis;
          puVar3 = Stack<rapidjson::CrtAllocator>::Push<unsigned_int>(&local_60,1);
          *puVar3 = 0;
          break;
        case 0x29:
          while( true ) {
            if (local_c0.stackTop_ == local_c0.stack_) goto LAB_00123f49;
            if ((ulong)((long)local_c0.stackTop_ - (long)local_c0.stack_) < 4) goto LAB_00123f98;
            pcVar7 = local_c0.stackTop_ + -4;
            pOVar5 = (Operator *)(local_c0.stackTop_ + -4);
            if (*pOVar5 == kLeftParenthesis) break;
            local_c0.stackTop_ = pcVar7;
            bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                              ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                               &local_90,*pOVar5);
            if (!bVar1) goto LAB_00123f49;
          }
          if (local_c0.stackTop_ == local_c0.stack_) goto LAB_00123f49;
          if ((ulong)((long)local_c0.stackTop_ - (long)local_c0.stack_) < 4) goto LAB_00123f79;
          if (3 < (ulong)((long)local_60.stackTop_ - (long)local_60.stack_)) {
            local_60.stackTop_ = local_60.stackTop_ + -4;
            local_c0.stackTop_ = pcVar7;
            goto LAB_00123e3d;
          }
          __function = 
          "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = unsigned int]"
          ;
          local_c0.stackTop_ = pcVar7;
          goto LAB_00123f8e;
        case 0x2a:
          bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                            ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                             &local_90,kZeroOrMore);
          goto LAB_00123ccf;
        case 0x2b:
          bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                            ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                             &local_90,kOneOrMore);
LAB_00123ccf:
          if (bVar1 == false) goto LAB_00123f49;
          break;
        case 0x2e:
          uVar8 = 0xffffffff;
LAB_00123cae:
          GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
                    ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,&local_90,
                     uVar8);
LAB_00123e3d:
          GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::ImplicitConcatenation
                    ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,&local_60,
                     &local_c0);
        }
      }
      else {
        if ((int)uVar8 < 0x5e) {
          if (uVar8 == 0x3f) {
            bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                              ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                               &local_90,kZeroOrOne);
            goto LAB_00123ccf;
          }
          if (uVar8 == 0x5b) {
            bVar1 = ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (this,ds,&local_cc);
            if (bVar1) {
              pSVar6 = Stack<rapidjson::CrtAllocator>::
                       Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                                 ((Stack<rapidjson::CrtAllocator> *)(this + 0x10),1);
              pSVar6->out = 0xffffffff;
              pSVar6->out1 = 0xffffffff;
              pSVar6->rangeStart = 0xffffffff;
              pSVar6->codepoint = 0xfffffffe;
              uVar8 = *(uint *)(this + 0x74);
              *(uint *)(this + 0x74) = uVar8 + 1;
              if (uVar8 + 1 == 0) {
                __assert_fail("index < stateCount_",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                              ,0xaa,
                              "State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                             );
              }
              *(uint *)(*(long *)(this + 0x20) + 8 + (ulong)uVar8 * 0x10) = local_cc;
              pFVar4 = Stack<rapidjson::CrtAllocator>::
                       Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                                 (&local_90,1);
              pFVar4->start = uVar8;
              pFVar4->out = uVar8;
              pFVar4->minIndex = uVar8;
              if (bVar1) goto LAB_00123e3d;
            }
          }
          else if ((uVar8 != 0x5c) ||
                  (bVar1 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                                     (this,ds,&local_c4), bVar1)) goto switchD_00123b62_caseD_25;
          goto LAB_00123f49;
        }
        if (uVar8 == 0x5e) {
          this[0x7c] = (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>)0x1;
        }
        else {
          if (uVar8 != 0x7b) {
            if (uVar8 != 0x7c) goto switchD_00123b62_caseD_25;
            while (local_c0.stackTop_ != local_c0.stack_) {
              if ((ulong)((long)local_c0.stackTop_ - (long)local_c0.stack_) < 4) goto LAB_00123f98;
              pOVar5 = (Operator *)(local_c0.stackTop_ + -4);
              if (3 < (int)*pOVar5) break;
              local_c0.stackTop_ = local_c0.stackTop_ + -4;
              bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                                ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                                 this,&local_90,*pOVar5);
              if (!bVar1) goto LAB_00123f49;
            }
            pOVar5 = Stack<rapidjson::CrtAllocator>::
                     Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                               (&local_c0,1);
            *pOVar5 = kAlternation;
            if ((ulong)((long)local_60.stackTop_ - (long)local_60.stack_) < 4) {
              pcVar7 = 
              "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = unsigned int]"
              ;
              goto LAB_00123fad;
            }
            local_60.stackTop_[-4] = '\0';
            local_60.stackTop_[-3] = '\0';
            local_60.stackTop_[-2] = '\0';
            local_60.stackTop_[-1] = '\0';
            goto LAB_00123e4f;
          }
          bVar1 = ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                            (this,ds,&local_cc);
          if (!bVar1) goto LAB_00123f49;
          if (*puVar2 == 0x2c) {
            bVar1 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (ds->ss_,puVar2);
            if (!bVar1) {
              *puVar2 = 0;
            }
            if (*puVar2 == 0x7d) {
              local_c8 = 0xffffffff;
            }
            else {
              bVar1 = ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                                (this,ds,&local_c8);
              if ((!bVar1) || (local_c8 < local_cc)) goto LAB_00123f49;
            }
          }
          else {
            local_c8 = local_cc;
          }
          bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EvalQuantifier
                            ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                             &local_90,local_cc,local_c8);
          if (!bVar1 || *puVar2 != 0x7d) goto LAB_00123f49;
          bVar1 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                            (ds->ss_,puVar2);
          if (!bVar1) {
            *puVar2 = 0;
          }
        }
      }
LAB_00123e4f:
      uVar8 = *puVar2;
    } while (uVar8 != 0);
  }
  do {
    if (local_c0.stackTop_ == local_c0.stack_) {
      if ((long)local_90.stackTop_ - (long)local_90.stack_ == 0xc) {
        pcVar7 = local_90.stackTop_ + -0xc;
        l = *(SizeType *)(local_90.stackTop_ + -8);
        local_90.stackTop_ = pcVar7;
        pSVar6 = Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                           ((Stack<rapidjson::CrtAllocator> *)(this + 0x10),1);
        pSVar6->out = 0xffffffff;
        pSVar6->out1 = 0xffffffff;
        pSVar6->rangeStart = 0xffffffff;
        pSVar6->codepoint = 0;
        s = *(SizeType *)(this + 0x74);
        *(SizeType *)(this + 0x74) = s + 1;
        GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Patch
                  ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,l,s);
        *(undefined4 *)(this + 0x70) = *(undefined4 *)pcVar7;
      }
      break;
    }
    if ((ulong)((long)local_c0.stackTop_ - (long)local_c0.stack_) < 4) {
LAB_00123f79:
      __function = 
      "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Operator]"
      ;
LAB_00123f8e:
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x8b,__function);
    }
    pOVar5 = (Operator *)(local_c0.stackTop_ + -4);
    local_c0.stackTop_ = local_c0.stackTop_ + -4;
    bVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
                      ((GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                       &local_90,*pOVar5);
  } while (bVar1);
LAB_00123f49:
  Stack<rapidjson::CrtAllocator>::Destroy(&local_60);
  Stack<rapidjson::CrtAllocator>::Destroy(&local_c0);
  Stack<rapidjson::CrtAllocator>::Destroy(&local_90);
  return;
LAB_00123f98:
  pcVar7 = 
  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Operator]"
  ;
LAB_00123fad:
  __assert_fail("GetSize() >= sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x92,pcVar7);
}

Assistant:

void Parse(DecodedStream<InputStream, Encoding>& ds) {
        Stack<Allocator> operandStack(allocator_, 256);    // Frag
        Stack<Allocator> operatorStack(allocator_, 256);   // Operator
        Stack<Allocator> atomCountStack(allocator_, 256);  // unsigned (Atom per parenthesis)

        *atomCountStack.template Push<unsigned>() = 0;

        unsigned codepoint;
        while (ds.Peek() != 0) {
            switch (codepoint = ds.Take()) {
                case '^':
                    anchorBegin_ = true;
                    break;

                case '$':
                    anchorEnd_ = true;
                    break;

                case '|':
                    while (!operatorStack.Empty() && *operatorStack.template Top<Operator>() < kAlternation)
                        if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                            return;
                    *operatorStack.template Push<Operator>() = kAlternation;
                    *atomCountStack.template Top<unsigned>() = 0;
                    break;

                case '(':
                    *operatorStack.template Push<Operator>() = kLeftParenthesis;
                    *atomCountStack.template Push<unsigned>() = 0;
                    break;

                case ')':
                    while (!operatorStack.Empty() && *operatorStack.template Top<Operator>() != kLeftParenthesis)
                        if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                            return;
                    if (operatorStack.Empty())
                        return;
                    operatorStack.template Pop<Operator>(1);
                    atomCountStack.template Pop<unsigned>(1);
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '?':
                    if (!Eval(operandStack, kZeroOrOne))
                        return;
                    break;

                case '*':
                    if (!Eval(operandStack, kZeroOrMore))
                        return;
                    break;

                case '+':
                    if (!Eval(operandStack, kOneOrMore))
                        return;
                    break;

                case '{':
                    {
                        unsigned n, m;
                        if (!ParseUnsigned(ds, &n))
                            return;

                        if (ds.Peek() == ',') {
                            ds.Take();
                            if (ds.Peek() == '}')
                                m = kInfinityQuantifier;
                            else if (!ParseUnsigned(ds, &m) || m < n)
                                return;
                        }
                        else
                            m = n;

                        if (!EvalQuantifier(operandStack, n, m) || ds.Peek() != '}')
                            return;
                        ds.Take();
                    }
                    break;

                case '.':
                    PushOperand(operandStack, kAnyCharacterClass);
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '[':
                    {
                        SizeType range;
                        if (!ParseRange(ds, &range))
                            return;
                        SizeType s = NewState(kRegexInvalidState, kRegexInvalidState, kRangeCharacterClass);
                        GetState(s).rangeStart = range;
                        *operandStack.template Push<Frag>() = Frag(s, s, s);
                    }
                    ImplicitConcatenation(atomCountStack, operatorStack);
                    break;

                case '\\': // Escape character
                    if (!CharacterEscape(ds, &codepoint))
                        return; // Unsupported escape character
                    // fall through to default
                    RAPIDJSON_DELIBERATE_FALLTHROUGH;

                default: // Pattern character
                    PushOperand(operandStack, codepoint);
                    ImplicitConcatenation(atomCountStack, operatorStack);
            }
        }

        while (!operatorStack.Empty())
            if (!Eval(operandStack, *operatorStack.template Pop<Operator>(1)))
                return;

        // Link the operand to matching state.
        if (operandStack.GetSize() == sizeof(Frag)) {
            Frag* e = operandStack.template Pop<Frag>(1);
            Patch(e->out, NewState(kRegexInvalidState, kRegexInvalidState, 0));
            root_ = e->start;

#if RAPIDJSON_REGEX_VERBOSE
            printf("root: %d\n", root_);
            for (SizeType i = 0; i < stateCount_ ; i++) {
                State& s = GetState(i);
                printf("[%2d] out: %2d out1: %2d c: '%c'\n", i, s.out, s.out1, (char)s.codepoint);
            }
            printf("\n");
#endif
        }
    }